

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQInteger sqstd_rex_element(SQRex *exp)

{
  char *pcVar1;
  byte *pbVar2;
  SQRexNode *pSVar3;
  int iVar4;
  uint uVar5;
  SQInteger c_1;
  SQInteger SVar6;
  SQInteger SVar7;
  long lVar8;
  SQInteger SVar9;
  SQChar **ppSVar10;
  byte bVar11;
  char *pcVar12;
  char cVar13;
  SQRexNodeType SVar14;
  SQInteger c;
  long lVar15;
  uint uVar16;
  
  pbVar2 = (byte *)exp->_p;
  bVar11 = *pbVar2;
  if (0x2d < bVar11) {
    if (bVar11 == 0x2e) {
      exp->_p = (SQChar *)(pbVar2 + 1);
      SVar14 = 0x104;
      goto LAB_00137af1;
    }
    if (bVar11 != 0x5b) goto LAB_00137ac5;
    exp->_p = (SQChar *)(pbVar2 + 1);
    if (pbVar2[1] == 0x5e) {
      SVar6 = sqstd_rex_newnode(exp,0x107);
      pcVar12 = exp->_p + 1;
      exp->_p = pcVar12;
    }
    else {
      SVar6 = sqstd_rex_newnode(exp,0x105);
      pcVar12 = exp->_p;
    }
    cVar13 = *pcVar12;
    if (cVar13 != ']') {
      lVar15 = -1;
      SVar7 = SVar6;
      do {
        lVar8 = lVar15;
        if (pcVar12 == exp->_eol) break;
        if (lVar15 == -1 || cVar13 != '-') {
          if (lVar15 == -1) {
            lVar8 = sqstd_rex_charnode(exp,1);
          }
          else {
            exp->_nodes[SVar7].next = lVar15;
            lVar8 = sqstd_rex_charnode(exp,1);
            SVar7 = lVar15;
          }
        }
        else {
          exp->_p = pcVar12 + 1;
          if (*pcVar12 == ']') {
            ppSVar10 = exp->_error;
            if (ppSVar10 == (SQChar **)0x0) goto LAB_00137e53;
            pcVar12 = "unfinished range";
            goto LAB_00137e50;
          }
          SVar9 = sqstd_rex_newnode(exp,0x108);
          pcVar12 = exp->_p;
          pSVar3 = exp->_nodes;
          if ((int)*pcVar12 < pSVar3[lVar15].type) {
            ppSVar10 = exp->_error;
            if (ppSVar10 == (SQChar **)0x0) goto LAB_00137e53;
            pcVar12 = "invalid range";
            goto LAB_00137e50;
          }
          pSVar3[SVar9].left = (long)pSVar3[lVar15].type;
          if (*pcVar12 == 0x5c) {
            pcVar1 = pcVar12 + 1;
            exp->_p = pcVar1;
            uVar5 = (int)pcVar12[1] - 0x66U >> 1;
            uVar16 = uVar5 | (uint)(((int)pcVar12[1] - 0x66U & 1) != 0) << 0x1f;
            exp->_p = pcVar12 + 2;
            pcVar12 = pcVar1;
            if ((uVar16 < 9) && ((0x1d1U >> (uVar5 & 0x1f) & 1) != 0)) {
              pcVar12 = &DAT_0013b724 + uVar16;
            }
          }
          else {
            iVar4 = isprint((int)*pcVar12);
            if (iVar4 == 0) {
              ppSVar10 = exp->_error;
              if (ppSVar10 == (SQChar **)0x0) goto LAB_00137e53;
              pcVar12 = "letter expected";
              goto LAB_00137e50;
            }
            exp->_p = pcVar12 + 1;
          }
          pSVar3[SVar9].right = (long)*pcVar12;
          pSVar3[SVar7].next = SVar9;
          lVar8 = -1;
          SVar7 = SVar9;
        }
        pcVar12 = exp->_p;
        cVar13 = *pcVar12;
        lVar15 = lVar8;
      } while (cVar13 != ']');
      pSVar3 = exp->_nodes;
      if (lVar8 != -1) {
        pSVar3[SVar7].next = lVar8;
      }
      pSVar3[SVar6].left = pSVar3[SVar6].next;
      pSVar3[SVar6].next = -1;
      SVar7 = 0x5d;
      goto LAB_00137c89;
    }
    ppSVar10 = exp->_error;
    if (ppSVar10 == (SQChar **)0x0) goto LAB_00137e53;
    pcVar12 = "empty class";
    goto LAB_00137e50;
  }
  if (bVar11 == 0x24) {
    exp->_p = (SQChar *)(pbVar2 + 1);
    SVar14 = 0x10a;
LAB_00137af1:
    SVar6 = sqstd_rex_newnode(exp,SVar14);
  }
  else if (bVar11 == 0x28) {
    exp->_p = (SQChar *)(pbVar2 + 1);
    SVar14 = 0x102;
    if (pbVar2[1] == 0x3f) {
      exp->_p = (SQChar *)(pbVar2 + 2);
      sqstd_rex_expect(exp,0x3a);
      SVar14 = 0x103;
    }
    SVar6 = sqstd_rex_newnode(exp,SVar14);
    SVar7 = sqstd_rex_list(exp);
    exp->_nodes[SVar6].left = SVar7;
    SVar7 = 0x29;
LAB_00137c89:
    sqstd_rex_expect(exp,SVar7);
  }
  else {
LAB_00137ac5:
    SVar6 = sqstd_rex_charnode(exp,0);
  }
  pbVar2 = (byte *)exp->_p;
  bVar11 = *pbVar2;
  if (bVar11 < 0x3f) {
    if (bVar11 == 0x2a) {
      exp->_p = (SQChar *)(pbVar2 + 1);
      uVar5 = 0xffff;
LAB_00137d30:
      uVar16 = 0;
    }
    else {
      if (bVar11 != 0x2b) goto LAB_00137da0;
      exp->_p = (SQChar *)(pbVar2 + 1);
      uVar5 = 0xffff;
      uVar16 = 0x10000;
    }
  }
  else {
    if (bVar11 == 0x3f) {
      exp->_p = (SQChar *)(pbVar2 + 1);
      uVar5 = 1;
      goto LAB_00137d30;
    }
    if (bVar11 != 0x7b) goto LAB_00137da0;
    exp->_p = (SQChar *)(pbVar2 + 1);
    if (9 < (int)(char)pbVar2[1] - 0x30U) {
      ppSVar10 = exp->_error;
      if (ppSVar10 == (SQChar **)0x0) goto LAB_00137e53;
      pcVar12 = "number expected";
LAB_00137e50:
      *ppSVar10 = pcVar12;
LAB_00137e53:
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    SVar7 = sqstd_rex_parsenumber(exp);
    pcVar12 = exp->_p;
    if (*pcVar12 == ',') {
      exp->_p = pcVar12 + 1;
      uVar5 = 0xffff;
      if ((int)pcVar12[1] - 0x30U < 10) {
        SVar9 = sqstd_rex_parsenumber(exp);
        uVar5 = (uint)SVar9;
      }
      sqstd_rex_expect(exp,0x7d);
    }
    else {
      if (*pcVar12 != '}') {
        ppSVar10 = exp->_error;
        if (ppSVar10 == (SQChar **)0x0) goto LAB_00137e53;
        pcVar12 = ", or } expected";
        goto LAB_00137e50;
      }
      exp->_p = pcVar12 + 1;
      uVar5 = (uint)SVar7;
    }
    uVar16 = (uint)SVar7 << 0x10;
    uVar5 = uVar5 & 0xffff;
  }
  SVar7 = sqstd_rex_newnode(exp,0x100);
  pSVar3 = exp->_nodes;
  pSVar3[SVar7].left = SVar6;
  pSVar3[SVar7].right = (long)(int)(uVar16 | uVar5);
  bVar11 = *exp->_p;
  SVar6 = SVar7;
LAB_00137da0:
  if (((0x2b < bVar11) || ((0xe0000000001U >> ((ulong)bVar11 & 0x3f) & 1) == 0)) && (bVar11 != 0x7c)
     ) {
    SVar7 = sqstd_rex_element(exp);
    exp->_nodes[SVar6].next = SVar7;
  }
  return SVar6;
}

Assistant:

static SQInteger sqstd_rex_element(SQRex *exp)
{
    SQInteger ret = -1;
    switch(*exp->_p)
    {
    case '(': {
        SQInteger expr;
        exp->_p++;


        if(*exp->_p =='?') {
            exp->_p++;
            sqstd_rex_expect(exp,':');
            expr = sqstd_rex_newnode(exp,OP_NOCAPEXPR);
        }
        else
            expr = sqstd_rex_newnode(exp,OP_EXPR);
        SQInteger newn = sqstd_rex_list(exp);
        exp->_nodes[expr].left = newn;
        ret = expr;
        sqstd_rex_expect(exp,')');
              }
              break;
    case '[':
        exp->_p++;
        ret = sqstd_rex_class(exp);
        sqstd_rex_expect(exp,']');
        break;
    case SQREX_SYMBOL_END_OF_STRING: exp->_p++; ret = sqstd_rex_newnode(exp,OP_EOL);break;
    case SQREX_SYMBOL_ANY_CHAR: exp->_p++; ret = sqstd_rex_newnode(exp,OP_DOT);break;
    default:
        ret = sqstd_rex_charnode(exp,SQFalse);
        break;
    }


    SQBool isgreedy = SQFalse;
    unsigned short p0 = 0, p1 = 0;
    switch(*exp->_p){
        case SQREX_SYMBOL_GREEDY_ZERO_OR_MORE: p0 = 0; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ONE_OR_MORE: p0 = 1; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ZERO_OR_ONE: p0 = 0; p1 = 1; exp->_p++; isgreedy = SQTrue; break;
        case '{':
            exp->_p++;
            if(!isdigit(*exp->_p)) sqstd_rex_error(exp,_SC("number expected"));
            p0 = (unsigned short)sqstd_rex_parsenumber(exp);
            /*******************************/
            switch(*exp->_p) {
        case '}':
            p1 = p0; exp->_p++;
            break;
        case ',':
            exp->_p++;
            p1 = 0xFFFF;
            if(isdigit(*exp->_p)){
                p1 = (unsigned short)sqstd_rex_parsenumber(exp);
            }
            sqstd_rex_expect(exp,'}');
            break;
        default:
            sqstd_rex_error(exp,_SC(", or } expected"));
            }
            /*******************************/
            isgreedy = SQTrue;
            break;

    }
    if(isgreedy) {
        SQInteger nnode = sqstd_rex_newnode(exp,OP_GREEDY);
        exp->_nodes[nnode].left = ret;
        exp->_nodes[nnode].right = ((p0)<<16)|p1;
        ret = nnode;
    }

    if((*exp->_p != SQREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != SQREX_SYMBOL_GREEDY_ZERO_OR_MORE) && (*exp->_p != SQREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        SQInteger nnode = sqstd_rex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}